

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

CTX_PTR CreateSuccessors(CPpmd8 *p,Bool skip,CPpmd_State *s1,CTX_PTR c)

{
  byte bVar1;
  uint uVar2;
  CPpmd_State *pCVar3;
  byte *pbVar4;
  Byte *pBVar5;
  CPpmd_State *pCVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  byte bVar14;
  char cVar15;
  CTX_PTR pCVar16;
  bool bVar17;
  CPpmd_State *ps [17];
  undefined8 uStack_c0;
  CPpmd_State *local_b8 [17];
  
  pCVar3 = p->FoundState;
  uVar2 = *(uint *)&pCVar3->SuccessorLow;
  bVar17 = skip == 0;
  if (bVar17) {
    local_b8[0] = pCVar3;
  }
  uVar10 = (uint)bVar17;
  uVar13 = c->Suffix;
  pBVar5 = p->Base;
  uVar9 = (ulong)bVar17;
  do {
    if (uVar13 == 0) {
LAB_00168982:
      bVar1 = pBVar5[uVar2];
      if (c->NumStats == 0) {
        cVar15 = *(char *)((long)&c->SummFreq + 1);
      }
      else {
        pbVar4 = pBVar5 + c->Stats;
        do {
          pbVar7 = pbVar4;
          pbVar4 = pbVar7 + 6;
        } while (*pbVar7 != bVar1);
        bVar14 = pbVar7[1];
        uVar13 = ((uint)c->SummFreq - ((uint)c->NumStats + (uint)bVar14)) + 1;
        if (uVar13 < (uint)bVar14 * 2 - 2) {
          cVar15 = (char)((((uint)bVar14 + uVar13 * 2) - 4) / uVar13);
        }
        else {
          cVar15 = uVar13 < (bVar14 - 1) * 5;
        }
        cVar15 = cVar15 + '\x01';
      }
      if (uVar10 != 0) {
        iVar11 = uVar2 + 1;
        bVar14 = (0x3f < bVar1) << 3 | (0x3f < pCVar3->Symbol) << 4;
        uVar9 = (ulong)uVar10;
        pCVar16 = c;
        iVar12 = iVar11;
        uStack_c0._3_1_ = bVar14;
        uStack_c0._4_4_ = iVar11;
        do {
          if (p->HiUnit == p->LoUnit) {
            uVar8 = (ulong)p->FreeList[0];
            if (uVar8 == 0) {
              c = (CTX_PTR)AllocUnitsRare(p,0);
              iVar12 = uStack_c0._4_4_;
              bVar14 = uStack_c0._3_1_;
              if (c == (CTX_PTR)0x0) {
                return (CTX_PTR)0x0;
              }
            }
            else {
              c = (CTX_PTR)(pBVar5 + uVar8);
              p->FreeList[0] = *(CPpmd_Void_Ref *)(pBVar5 + uVar8 + 4);
              p->Stamps[0] = p->Stamps[0] - 1;
            }
          }
          else {
            c = (CTX_PTR)(p->HiUnit + -0xc);
            p->HiUnit = (Byte *)c;
          }
          c->NumStats = '\0';
          c->Flags = bVar14;
          *(byte *)&c->SummFreq = bVar1;
          *(char *)((long)&c->SummFreq + 1) = cVar15;
          *(short *)&c->Stats = (short)iVar12;
          *(short *)((long)&c->Stats + 2) = (short)((uint)iVar11 >> 0x10);
          pBVar5 = p->Base;
          c->Suffix = (int)pCVar16 - (int)pBVar5;
          *(int *)((&uStack_c0)[uVar9] + 2) = (int)c - (int)pBVar5;
          uVar9 = uVar9 - 1;
          pCVar16 = c;
        } while (uVar9 != 0);
      }
      return c;
    }
    uVar10 = (uint)uVar9;
    c = (CTX_PTR)(pBVar5 + uVar13);
    if (s1 == (CPpmd_State *)0x0) {
      if (c->NumStats == '\0') {
        s1 = (CPpmd_State *)&c->SummFreq;
        bVar1 = *(byte *)((long)&c->SummFreq + 1);
        *(byte *)((long)&c->SummFreq + 1) = (bVar1 < 0x18 && pBVar5[c->Suffix] == '\0') + bVar1;
      }
      else {
        s1 = (CPpmd_State *)(pBVar5 + ((ulong)c->Stats - 6));
        do {
          pCVar6 = s1;
          s1 = pCVar6 + 1;
        } while ((Byte)*(CPpmd8_Context_Ref *)&pCVar6[1].Symbol != pCVar3->Symbol);
        if (pCVar6[1].Freq < 0x73) {
          pCVar6[1].Freq = pCVar6[1].Freq + 1;
          c->SummFreq = c->SummFreq + 1;
        }
      }
    }
    if (*(uint *)&s1->SuccessorLow != uVar2) {
      c = (CTX_PTR)(pBVar5 + *(uint *)&s1->SuccessorLow);
      if (uVar10 == 0) {
        return c;
      }
      goto LAB_00168982;
    }
    uVar10 = uVar10 + 1;
    local_b8[uVar9] = s1;
    uVar13 = c->Suffix;
    s1 = (CPpmd_State *)0x0;
    uVar9 = (ulong)uVar10;
  } while( true );
}

Assistant:

static CTX_PTR CreateSuccessors(CPpmd8 *p, Bool skip, CPpmd_State *s1, CTX_PTR c)
{
  CPpmd_State upState;
  Byte flags;
  CPpmd_Byte_Ref upBranch = (CPpmd_Byte_Ref)SUCCESSOR(p->FoundState);
  /* fixed over Shkarin's code. Maybe it could work without + 1 too. */
  CPpmd_State *ps[PPMD8_MAX_ORDER + 1];
  unsigned numPs = 0;
  
  if (!skip)
    ps[numPs++] = p->FoundState;
  
  while (c->Suffix)
  {
    CPpmd_Void_Ref successor;
    CPpmd_State *s;
    c = SUFFIX(c);
    if (s1)
    {
      s = s1;
      s1 = NULL;
    }
    else if (c->NumStats != 0)
    {
      for (s = STATS(c); s->Symbol != p->FoundState->Symbol; s++);
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq++;
        c->SummFreq++;
      }
    }
    else
    {
      s = ONE_STATE(c);
      s->Freq = (Byte)(s->Freq + (!SUFFIX(c)->NumStats & (s->Freq < 24)));
    }
    successor = SUCCESSOR(s);
    if (successor != upBranch)
    {
      c = CTX(successor);
      if (numPs == 0)
        return c;
      break;
    }
    ps[numPs++] = s;
  }
  
  upState.Symbol = *(const Byte *)Ppmd8_GetPtr(p, upBranch);
  SetSuccessor(&upState, upBranch + 1);
  flags = (Byte)(0x10 * (p->FoundState->Symbol >= 0x40) + 0x08 * (upState.Symbol >= 0x40));

  if (c->NumStats == 0)
    upState.Freq = ONE_STATE(c)->Freq;
  else
  {
    UInt32 cf, s0;
    CPpmd_State *s;
    for (s = STATS(c); s->Symbol != upState.Symbol; s++);
    cf = s->Freq - 1;
    s0 = c->SummFreq - c->NumStats - cf;
    upState.Freq = (Byte)(1 + ((2 * cf <= s0) ? (5 * cf > s0) : ((cf + 2 * s0 - 3) / s0)));
  }

  while (numPs != 0)
  {
    /* Create Child */
    CTX_PTR c1; /* = AllocContext(p); */
    if (p->HiUnit != p->LoUnit)
      c1 = (CTX_PTR)(p->HiUnit -= UNIT_SIZE);
    else if (p->FreeList[0] != 0)
      c1 = (CTX_PTR)RemoveNode(p, 0);
    else
    {
      c1 = (CTX_PTR)AllocUnitsRare(p, 0);
      if (!c1)
        return NULL;
    }
    c1->NumStats = 0;
    c1->Flags = flags;
    *ONE_STATE(c1) = upState;
    c1->Suffix = REF(c);
    SetSuccessor(ps[--numPs], REF(c1));
    c = c1;
  }

  return c;
}